

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall PrimitiveTestClass::~PrimitiveTestClass(PrimitiveTestClass *this)

{
  TestArrObj *pTVar1;
  long lVar2;
  long lVar3;
  
  if (this->str != (char *)0x0) {
    operator_delete__(this->str);
  }
  if (this->pc != (char *)0x0) {
    operator_delete__(this->pc);
  }
  if (this->puc != (uchar *)0x0) {
    operator_delete__(this->puc);
  }
  if (this->ps != (short *)0x0) {
    operator_delete__(this->ps);
  }
  if (this->pus != (unsigned_short *)0x0) {
    operator_delete__(this->pus);
  }
  if (this->pi != (int *)0x0) {
    operator_delete__(this->pi);
  }
  if (this->pui != (uint *)0x0) {
    operator_delete__(this->pui);
  }
  if (this->pl != (long *)0x0) {
    operator_delete__(this->pl);
  }
  if (this->pul != (unsigned_long *)0x0) {
    operator_delete__(this->pul);
  }
  if (this->pll != (longlong *)0x0) {
    operator_delete__(this->pll);
  }
  if (this->pull != (unsigned_long_long *)0x0) {
    operator_delete__(this->pull);
  }
  if (this->pf != (float *)0x0) {
    operator_delete__(this->pf);
  }
  if (this->pld != (longdouble *)0x0) {
    operator_delete__(this->pld);
  }
  if (this->pd != (double *)0x0) {
    operator_delete__(this->pd);
  }
  pTVar1 = this->pto;
  if (pTVar1 != (TestArrObj *)0x0) {
    lVar2 = *(long *)((long)&pTVar1[-1].str.field_2 + 8);
    if (lVar2 != 0) {
      lVar3 = lVar2 << 5;
      do {
        std::__cxx11::string::~string((string *)((long)&pTVar1[-1].str._M_dataplus._M_p + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != 0);
    }
    operator_delete__((void *)((long)&pTVar1[-1].str.field_2 + 8),lVar2 << 5 | 8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~PrimitiveTestClass()
        {
            delete[] str;

            delete[] pc;
            delete[] puc;
            delete[] ps;
            delete[] pus;
            delete[] pi;
            delete[] pui;
            delete[] pl;
            delete[] pul;
            delete[] pll;
            delete[] pull;
            delete[] pf;
            delete[] pld;
            delete[] pd;
            delete[] pto;
        }